

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall polyscope::CurveNetwork::drawPick(CurveNetwork *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDI;
  ShaderProgram *in_stack_00000178;
  CurveNetwork *in_stack_00000180;
  ShaderProgram *in_stack_00000518;
  Structure *in_stack_00000520;
  CurveNetwork *in_stack_00000550;
  nullptr_t in_stack_ffffffffffffffe8;
  
  bVar1 = Structure::isEnabled((Structure *)0x4ac008);
  if (bVar1) {
    bVar1 = std::operator==((shared_ptr<polyscope::render::ShaderProgram> *)in_RDI,
                            in_stack_ffffffffffffffe8);
    if ((bVar1) ||
       (bVar1 = std::operator==((shared_ptr<polyscope::render::ShaderProgram> *)in_RDI,
                                in_stack_ffffffffffffffe8), bVar1)) {
      preparePick(in_stack_00000550);
    }
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RDI);
    Structure::setStructureUniforms(in_stack_00000520,in_stack_00000518);
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RDI);
    Structure::setStructureUniforms(in_stack_00000520,in_stack_00000518);
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RDI);
    setCurveNetworkEdgeUniforms(in_stack_00000180,in_stack_00000178);
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RDI);
    setCurveNetworkNodeUniforms(in_stack_00000180,in_stack_00000178);
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4ac0d8);
    (*peVar2->_vptr_ShaderProgram[0x24])();
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4ac0f5);
    (*peVar2->_vptr_ShaderProgram[0x24])();
  }
  return;
}

Assistant:

void CurveNetwork::drawPick() {
  if (!isEnabled()) {
    return;
  }

  // Ensure we have prepared buffers
  if (edgePickProgram == nullptr || nodePickProgram == nullptr) {
    preparePick();
  }

  // Set uniforms
  setStructureUniforms(*edgePickProgram);
  setStructureUniforms(*nodePickProgram);

  setCurveNetworkEdgeUniforms(*edgePickProgram);
  setCurveNetworkNodeUniforms(*nodePickProgram);

  edgePickProgram->draw();
  nodePickProgram->draw();
}